

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

float deqp::gles2::Performance::vectorFloatMedianAbsoluteDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  pointer plVar1;
  long lVar2;
  pointer pfVar3;
  pointer pfVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  vector<float,_std::allocator<float>_> absoluteDeviations;
  vector<float,_std::allocator<float>_> local_40;
  vector<float,_std::allocator<float>_> local_28;
  
  fVar8 = vectorFloatMedian<long>(v);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_28,
             (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_40);
  plVar1 = (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (uint)((ulong)((long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)plVar1) >> 3);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      fVar9 = (float)plVar1[uVar6] - fVar8;
      uVar7 = -(uint)(-fVar9 <= fVar9);
      local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = (float)(~uVar7 & (uint)-fVar9 | (uint)fVar9 & uVar7);
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_40,&local_28);
  pfVar3 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar4 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar6 = (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar4,pfVar3);
    pfVar4 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar6 = (ulong)((long)pfVar4 -
                  (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) >> 1;
  if (((long)pfVar4 -
       (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start & 4U) == 0) {
    fVar8 = (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6 - 1] +
            local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6]) * 0.5;
  }
  else {
    fVar8 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
  }
  operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return fVar8;
}

Assistant:

static float vectorFloatMedianAbsoluteDeviation (const vector<T>& v)
{
	float			median				= vectorFloatMedian(v);
	vector<float>	absoluteDeviations	(v.size());

	for (int i = 0; i < (int)v.size(); i++)
		absoluteDeviations[i] = deFloatAbs((float)v[i] - median);

	return vectorFloatMedian(absoluteDeviations);
}